

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

QRhi * __thiscall QWidgetPrivate::rhi(QWidgetPrivate *this)

{
  QBackingStore *pQVar1;
  QWindow *pQVar2;
  QRhi *pQVar3;
  
  pQVar1 = QWidget::backingStore(*(QWidget **)&this->field_0x8);
  if (pQVar1 != (QBackingStore *)0x0) {
    windowHandle(this,Closest);
    pQVar2 = (QWindow *)QBackingStore::handle();
    pQVar3 = (QRhi *)QPlatformBackingStore::rhi(pQVar2);
    return pQVar3;
  }
  return (QRhi *)0x0;
}

Assistant:

QRhi *QWidgetPrivate::rhi() const
{
    Q_Q(const QWidget);
    if (auto *backingStore = q->backingStore()) {
        auto *window = windowHandle(WindowHandleMode::Closest);
        return backingStore->handle()->rhi(window);
    } else {
        return nullptr;
    }
}